

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcExact.c
# Opt level: O3

void Ses_ManCreateMainClause(Ses_Man_t *pSes,int t,int i,int j,int k,int a,int b,int c)

{
  int iVar1;
  int iVar2;
  ulong uVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  int iVar8;
  int iVar9;
  uint uVar10;
  uint uVar11;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  uint uVar19;
  int iVar20;
  uint uVar21;
  int iVar22;
  uint uVar23;
  uint uVar24;
  uint uVar25;
  int iVar26;
  int local_38 [6];
  
  iVar2 = pSes->nGates;
  if (iVar2 <= i) {
    __assert_fail("i < pSes->nGates",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcExact.c"
                  ,999,"int Ses_ManSelectVar(Ses_Man_t *, int, int, int)");
  }
  iVar1 = pSes->nSpecVars;
  iVar4 = iVar1 + i;
  if (iVar4 <= k) {
    __assert_fail("k < pSes->nSpecVars + i",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcExact.c"
                  ,1000,"int Ses_ManSelectVar(Ses_Man_t *, int, int, int)");
  }
  if (k <= j) {
    __assert_fail("j < k",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcExact.c"
                  ,0x3e9,"int Ses_ManSelectVar(Ses_Man_t *, int, int, int)");
  }
  uVar11 = pSes->nSelectOffset;
  if (0 < i) {
    iVar5 = iVar1 + 1;
    if (iVar1 + 1 < iVar4) {
      iVar5 = iVar4;
    }
    uVar7 = (iVar5 - iVar1) - 1;
    iVar22 = iVar1 + 1;
    uVar24 = iVar1 + 2;
    iVar26 = iVar1 + 3;
    iVar9 = 4;
    uVar15 = 0;
    uVar17 = 0;
    uVar19 = 0;
    iVar20 = iVar1;
    do {
      uVar18 = uVar19;
      uVar16 = uVar17;
      uVar14 = uVar15;
      uVar10 = uVar11;
      auVar12._0_4_ = iVar20 + -1;
      auVar12._4_4_ = iVar22 + -1;
      auVar12._8_4_ = uVar24 - 1;
      auVar12._12_4_ = iVar26 - 1;
      auVar13._4_4_ = iVar22;
      auVar13._0_4_ = iVar22;
      auVar13._8_4_ = iVar26;
      auVar13._12_4_ = iVar26;
      uVar11 = (auVar12._0_4_ * iVar20) / 2 + uVar10;
      uVar15 = (iVar22 * auVar12._4_4_) / 2 + uVar14;
      uVar17 = (int)((auVar12._8_8_ & 0xffffffff) * (ulong)uVar24) / 2 + uVar16;
      uVar19 = (int)((auVar13._8_8_ & 0xffffffff) * (ulong)auVar12._12_4_) / 2 + uVar18;
      iVar20 = iVar20 + 4;
      iVar22 = iVar22 + 4;
      uVar24 = uVar24 + 4;
      iVar26 = iVar26 + 4;
      iVar6 = iVar9 + -4;
      iVar8 = iVar9 + ((iVar5 - iVar1) + 3U & 0xfffffffc);
      iVar9 = iVar6;
    } while (iVar8 != 8);
    uVar24 = -iVar6;
    uVar21 = -(uint)((int)(uVar7 ^ 0x80000000) < (int)(uVar24 ^ 0x80000000));
    uVar23 = -(uint)((int)(uVar7 ^ 0x80000000) < (int)((uVar24 | 1) ^ 0x80000000));
    uVar25 = -(uint)((int)(uVar7 ^ 0x80000000) < (int)((uVar24 | 2) ^ 0x80000000));
    uVar7 = -(uint)((int)(uVar7 ^ 0x80000000) < (int)((uVar24 | 3) ^ 0x80000000));
    uVar11 = (~uVar7 & uVar19 | uVar18 & uVar7) + (~uVar23 & uVar15 | uVar14 & uVar23) +
             (~uVar25 & uVar17 | uVar16 & uVar25) + (~uVar21 & uVar11 | uVar10 & uVar21);
  }
  iVar4 = ~j + k + ((~j + iVar4 * 2) * j) / 2 + uVar11;
  if (-1 < iVar4) {
    local_38[0] = iVar4 * 2 + 1;
    iVar4 = pSes->nRows;
    if (iVar4 <= t) {
      __assert_fail("t < pSes->nRows",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcExact.c"
                    ,0x3cb,"int Ses_ManSimVar(Ses_Man_t *, int, int)");
    }
    iVar5 = pSes->nSimOffset;
    iVar9 = iVar4 * i + iVar5 + t;
    if (iVar9 < 0) goto LAB_002c3502;
    local_38[1] = a + iVar9 * 2;
    if (j < iVar1) {
      uVar11 = 2;
      if ((uint)((t + 1U >> (j & 0x1fU) & 1) != 0) != b) {
        return;
      }
    }
    else {
      if (iVar2 <= j - iVar1) goto LAB_002c359d;
      iVar9 = (j - iVar1) * iVar4 + t + iVar5;
      if (iVar9 < 0) goto LAB_002c3502;
      local_38[2] = b + iVar9 * 2;
      uVar11 = 3;
    }
    if (k < iVar1) {
      if ((uint)((t + 1U >> (k & 0x1fU) & 1) != 0) != c) {
        return;
      }
    }
    else {
      if (iVar2 <= k - iVar1) {
LAB_002c359d:
        __assert_fail("i < pSes->nGates",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcExact.c"
                      ,0x3ca,"int Ses_ManSimVar(Ses_Man_t *, int, int)");
      }
      iVar5 = iVar4 * (k - iVar1) + t + iVar5;
      if (iVar5 < 0) goto LAB_002c3502;
      uVar3 = (ulong)uVar11;
      uVar11 = uVar11 + 1;
      local_38[uVar3] = c + iVar5 * 2;
    }
    if (0 < b || 0 < c) {
      iVar2 = i * 3 + b * 2 + c + pSes->nGateOffset + -1;
      if (iVar2 < 0) goto LAB_002c3502;
      uVar3 = (ulong)uVar11;
      uVar11 = uVar11 + 1;
      local_38[uVar3] = (iVar2 * 2 - a) + 1;
    }
    sat_solver_addclause(pSes->pSat,local_38,local_38 + uVar11);
    return;
  }
LAB_002c3502:
  __assert_fail("Var >= 0 && !(c >> 1)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                ,0x12e,"int Abc_Var2Lit(int, int)");
}

Assistant:

static inline void Ses_ManCreateMainClause( Ses_Man_t * pSes, int t, int i, int j, int k, int a, int b, int c )
{
    int pLits[5], ctr = 0;

    pLits[ctr++] = Abc_Var2Lit( Ses_ManSelectVar( pSes, i, j, k ), 1 );
    pLits[ctr++] = Abc_Var2Lit( Ses_ManSimVar( pSes, i, t ), a );

    if ( j < pSes->nSpecVars )
    {
        if ( ( ( ( t + 1 ) & ( 1 << j ) ) ? 1 : 0 ) != b )
            return;
    }
    else
        pLits[ctr++] = Abc_Var2Lit( Ses_ManSimVar( pSes, j - pSes->nSpecVars, t ), b );

    if ( k < pSes->nSpecVars )
    {
        if ( ( ( ( t + 1 ) & ( 1 << k ) ) ? 1 : 0 ) != c )
            return;
    }
    else
        pLits[ctr++] = Abc_Var2Lit( Ses_ManSimVar( pSes, k - pSes->nSpecVars, t ), c );

    if ( b > 0 || c > 0 )
        pLits[ctr++] = Abc_Var2Lit( Ses_ManGateVar( pSes, i, b, c ), 1 - a );

    sat_solver_addclause( pSes->pSat, pLits, pLits + ctr );
}